

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Thermo::getCurrentDensity
          (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
           *__return_storage_ptr__,Thermo *this)

{
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  Snapshot *pSVar3;
  AtomType *pAVar4;
  bool bVar5;
  uint i;
  Molecule *pMVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ulong uVar10;
  uint i_1;
  pointer pVVar11;
  uint uVar12;
  long lVar13;
  pointer ppRVar14;
  Atom *pAVar15;
  ulong uVar16;
  int iVar17;
  RigidBody *this_00;
  pointer ppAVar18;
  RealType RVar19;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *result;
  FixedChargeAdapter fca;
  MoleculeIterator miter;
  Vector<double,_3U> result_1;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> typeJc;
  FluctuatingChargeAdapter fqa;
  AtomTypeSet simTypes;
  undefined8 local_f0;
  FixedChargeAdapter local_e8;
  MoleculeIterator local_e0;
  double local_d8 [3];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_c0;
  value_type local_a8;
  Snapshot *local_90;
  Thermo *local_88;
  FluctuatingChargeAdapter local_80;
  double local_78 [3];
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pSVar3 = this->info_->sman_->currentSnapshot_;
  SimInfo::getSimulatedAtomTypes((AtomTypeSet *)&local_60,this->info_);
  local_e0._M_node = (_Base_ptr)0x0;
  local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            (&local_c0,local_60._M_impl.super__Rb_tree_header._M_node_count,
             (value_type *)OpenMD::V3Zero,(allocator_type *)local_78);
  local_90 = pSVar3;
  pMVar6 = SimInfo::beginMolecule(this->info_,&local_e0);
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_88 = this;
  while (pMVar6 != (Molecule *)0x0) {
    ppRVar14 = (pMVar6->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (ppRVar14 ==
        (pMVar6->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = (RigidBody *)0x0;
    }
    else {
      this_00 = *ppRVar14;
    }
    while (this_00 != (RigidBody *)0x0) {
      ppRVar14 = ppRVar14 + 1;
      RigidBody::updateAtomVel(this_00);
      if (ppRVar14 ==
          (pMVar6->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (RigidBody *)0x0;
      }
      else {
        this_00 = *ppRVar14;
      }
    }
    ppAVar18 = (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppAVar18 ==
          (pMVar6->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar15 = (Atom *)0x0;
      }
      else {
        pAVar15 = *ppAVar18;
      }
      if (pAVar15 == (Atom *)0x0) break;
      lVar13 = (long)(pAVar15->super_StuntDouble).localIndex_;
      lVar9 = *(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                               atomData).velocity.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                       (pAVar15->super_StuntDouble).storage_);
      local_78[2] = *(double *)(lVar9 + 0x10 + lVar13 * 0x18);
      pdVar1 = (double *)(lVar9 + lVar13 * 0x18);
      local_78[0] = *pdVar1;
      local_78[1] = pdVar1[1];
      pAVar4 = pAVar15->atomType_;
      local_e8.at_ = pAVar4;
      bVar5 = FixedChargeAdapter::isFixedCharge(&local_e8);
      local_f0 = 0.0;
      if (bVar5) {
        local_f0 = FixedChargeAdapter::getCharge(&local_e8);
      }
      local_80.at_ = pAVar4;
      bVar5 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_80);
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar5) {
        local_f0 = local_f0 +
                   *(double *)
                    (*(long *)((long)&(((pAVar15->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQPos.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar15->super_StuntDouble).storage_) +
                    (long)(pAVar15->super_StuntDouble).localIndex_ * 8);
      }
      for (; ((_Rb_tree_header *)p_Var7 != p_Var2 && (*(AtomType **)(p_Var7 + 1) != pAVar4));
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      }
      if ((_Rb_tree_header *)p_Var7 == p_Var2) {
        iVar17 = -1;
      }
      else {
        iVar17 = 0;
        while (p_Var8 != p_Var7) {
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          iVar17 = iVar17 + 1;
        }
      }
      if (iVar17 != -1) {
        local_d8[0] = 0.0;
        local_d8[1] = 0.0;
        local_d8[2] = 0.0;
        lVar9 = 0;
        do {
          local_d8[lVar9] = local_78[lVar9] * local_f0;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 0;
        do {
          local_c0.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar17].super_Vector<double,_3U>.data_[lVar9] =
               local_d8[lVar9] +
               local_c0.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].super_Vector<double,_3U>.data_
               [lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      lVar9 = 0;
      do {
        local_d8[lVar9] = local_78[lVar9] * local_f0;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        local_a8.super_Vector<double,_3U>.data_[lVar9] =
             local_d8[lVar9] + local_a8.super_Vector<double,_3U>.data_[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      ppAVar18 = ppAVar18 + 1;
    }
    pMVar6 = SimInfo::nextMolecule(local_88->info_,&local_e0);
  }
  RVar19 = Snapshot::getVolume(local_90);
  lVar9 = 0;
  do {
    local_a8.super_Vector<double,_3U>.data_[lVar9] =
         local_a8.super_Vector<double,_3U>.data_[lVar9] / (RVar19 * 6.241573027317e-17);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar12 = 0;
    pVVar11 = local_c0.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      lVar9 = 0;
      do {
        (pVVar11->super_Vector<double,_3U>).data_[lVar9] =
             (pVVar11->super_Vector<double,_3U>).data_[lVar9] / (RVar19 * 6.241573027317e-17);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      uVar12 = uVar12 + 1;
      pVVar11 = pVVar11 + 1;
    } while (uVar12 < local_60._M_impl.super__Rb_tree_header._M_node_count);
  }
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (__return_storage_ptr__,&local_a8);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    uVar10 = 0;
    uVar16 = 1;
    do {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                (__return_storage_ptr__,
                 local_c0.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10);
      bVar5 = uVar16 < local_60._M_impl.super__Rb_tree_header._M_node_count;
      uVar10 = uVar16;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar5);
  }
  if (local_c0.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector3d> Thermo::getCurrentDensity() {
    Snapshot* snap       = info_->getSnapshotManager()->getCurrentSnapshot();
    AtomTypeSet simTypes = info_->getSimulatedAtomTypes();

    SimInfo::MoleculeIterator miter;
    std::vector<Atom*>::iterator iiter;
    std::vector<RigidBody*>::iterator ri;
    Molecule* mol;
    RigidBody* rb;
    Atom* atom;
    AtomType* atype;
    AtomTypeSet::iterator at;
    Vector3d Jc(0.0);
    std::vector<Vector3d> typeJc(simTypes.size(), V3Zero);

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      // change the velocities of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        rb->updateAtomVel();
      }

      for (atom = mol->beginAtom(iiter); atom != NULL;
           atom = mol->nextAtom(iiter)) {
        Vector3d v = atom->getVel();
        RealType q = 0.0;
        int typeIndex(-1);

        atype                  = atom->getAtomType();
        FixedChargeAdapter fca = FixedChargeAdapter(atype);
        if (fca.isFixedCharge()) q = fca.getCharge();
        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
        if (fqa.isFluctuatingCharge()) q += atom->getFlucQPos();

        typeIndex = -1;
        at        = std::find(simTypes.begin(), simTypes.end(), atype);
        if (at != simTypes.end()) {
          typeIndex = std::distance(simTypes.begin(), at);
        }

        if (typeIndex != -1) { typeJc[typeIndex] += q * v; }
        Jc += q * v;
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Jc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      MPI_Allreduce(MPI_IN_PLACE, &typeJc[j][0], 3, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    RealType vol = snap->getVolume();

    Jc /= (vol * Constants::currentDensityConvert);
    for (unsigned int j = 0; j < simTypes.size(); j++) {
      typeJc[j] /= (vol * Constants::currentDensityConvert);
    }

    std::vector<Vector3d> result;
    result.clear();

    result.push_back(Jc);
    for (unsigned int j = 0; j < simTypes.size(); j++)
      result.push_back(typeJc[j]);

    return result;
  }